

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

void __thiscall wabt::interp::Store::Mark(Store *this,RefVec *refs)

{
  bool bVar1;
  reference pRVar2;
  Ref *ref;
  const_iterator __end2;
  const_iterator __begin2;
  RefVec *__range2;
  RefVec *refs_local;
  Store *this_local;
  
  __end2 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::begin(refs);
  ref = (Ref *)std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::end(refs);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
                                *)&ref);
    if (!bVar1) break;
    pRVar2 = __gnu_cxx::
             __normal_iterator<const_wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
             ::operator*(&__end2);
    Mark(this,(Ref)pRVar2->index);
    __gnu_cxx::
    __normal_iterator<const_wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void Store::Mark(const RefVec& refs) {
  for (auto&& ref: refs) {
    Mark(ref);
  }
}